

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O2

void ImGui_ImplGlfw_CursorEnterCallback(GLFWwindow *window,int entered)

{
  int iVar1;
  ImGui_ImplGlfw_Data *pIVar2;
  ImGuiIO *this;
  float x;
  float y;
  
  pIVar2 = ImGui_ImplGlfw_GetBackendData();
  if ((pIVar2->PrevUserCallbackCursorEnter != (GLFWcursorenterfun)0x0) && (pIVar2->Window == window)
     ) {
    (*pIVar2->PrevUserCallbackCursorEnter)(window,entered);
  }
  iVar1 = glfwGetInputMode(window,0x33001);
  if (iVar1 != 0x34003) {
    this = ImGui::GetIO();
    if (entered == 0) {
      if (pIVar2->MouseWindow != window) {
        return;
      }
      pIVar2->LastValidMousePos = this->MousePos;
      pIVar2->MouseWindow = (GLFWwindow *)0x0;
      x = -3.4028235e+38;
      y = -3.4028235e+38;
    }
    else {
      pIVar2->MouseWindow = window;
      x = (pIVar2->LastValidMousePos).x;
      y = (pIVar2->LastValidMousePos).y;
    }
    ImGuiIO::AddMousePosEvent(this,x,y);
    return;
  }
  return;
}

Assistant:

void ImGui_ImplGlfw_CursorEnterCallback(GLFWwindow* window, int entered)
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    if (bd->PrevUserCallbackCursorEnter != nullptr && window == bd->Window)
        bd->PrevUserCallbackCursorEnter(window, entered);
    if (glfwGetInputMode(window, GLFW_CURSOR) == GLFW_CURSOR_DISABLED)
        return;

    ImGuiIO& io = ImGui::GetIO();
    if (entered)
    {
        bd->MouseWindow = window;
        io.AddMousePosEvent(bd->LastValidMousePos.x, bd->LastValidMousePos.y);
    }
    else if (!entered && bd->MouseWindow == window)
    {
        bd->LastValidMousePos = io.MousePos;
        bd->MouseWindow = nullptr;
        io.AddMousePosEvent(-FLT_MAX, -FLT_MAX);
    }
}